

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::CoverCrossSyntax::CoverCrossSyntax(CoverCrossSyntax *this,CoverCrossSyntax *param_2)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  
  (this->super_MemberSyntax).super_SyntaxNode.previewNode =
       (param_2->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(param_2->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->super_MemberSyntax).super_SyntaxNode.parent;
  (this->super_MemberSyntax).super_SyntaxNode.kind =
       (param_2->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(this->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00596408;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (param_2->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (param_2->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005968d0;
  (this->cross).info = (param_2->cross).info;
  TVar6 = (param_2->cross).kind;
  uVar7 = (param_2->cross).field_0x2;
  NVar8.raw = (param_2->cross).numFlags.raw;
  uVar9 = (param_2->cross).rawLen;
  this->label = param_2->label;
  (this->cross).kind = TVar6;
  (this->cross).field_0x2 = uVar7;
  (this->cross).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->cross).rawLen = uVar9;
  uVar5 = *(undefined4 *)&(param_2->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase.childCount = (param_2->items).super_SyntaxListBase.childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00599c60;
  sVar2 = (param_2->items).elements._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (param_2->items).elements._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar2;
  (this->openBrace).info = (param_2->openBrace).info;
  TVar6 = (param_2->openBrace).kind;
  uVar7 = (param_2->openBrace).field_0x2;
  NVar8.raw = (param_2->openBrace).numFlags.raw;
  uVar9 = (param_2->openBrace).rawLen;
  this->iff = param_2->iff;
  (this->openBrace).kind = TVar6;
  (this->openBrace).field_0x2 = uVar7;
  (this->openBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->openBrace).rawLen = uVar9;
  uVar5 = *(undefined4 *)&(param_2->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00596408;
  (this->members).super_SyntaxListBase.childCount =
       (param_2->members).super_SyntaxListBase.childCount;
  sVar2 = (param_2->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (param_2->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005994d8;
  uVar7 = (param_2->closeBrace).field_0x2;
  NVar8.raw = (param_2->closeBrace).numFlags.raw;
  uVar9 = (param_2->closeBrace).rawLen;
  pIVar3 = (param_2->closeBrace).info;
  TVar6 = (param_2->emptySemi).kind;
  uVar10 = (param_2->emptySemi).field_0x2;
  NVar11.raw = (param_2->emptySemi).numFlags.raw;
  uVar12 = (param_2->emptySemi).rawLen;
  pIVar4 = (param_2->emptySemi).info;
  (this->closeBrace).kind = (param_2->closeBrace).kind;
  (this->closeBrace).field_0x2 = uVar7;
  (this->closeBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->closeBrace).rawLen = uVar9;
  (this->closeBrace).info = pIVar3;
  (this->emptySemi).kind = TVar6;
  (this->emptySemi).field_0x2 = uVar10;
  (this->emptySemi).numFlags = (NumericTokenFlags)NVar11.raw;
  (this->emptySemi).rawLen = uVar12;
  (this->emptySemi).info = pIVar4;
  return;
}

Assistant:

explicit MemberSyntax(const MemberSyntax&) = default;